

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O3

Vec_Ptr_t * Abc_NodeGetSuper(Abc_Obj_t *pNode)

{
  long *plVar1;
  int iVar2;
  uint *__ptr;
  void *pvVar3;
  uint *__ptr_00;
  undefined8 *puVar4;
  ulong *puVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong local_48;
  
  if ((((ulong)pNode & 1) == 0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
    __ptr = (uint *)malloc(0x10);
    __ptr[1] = 0;
    pvVar3 = malloc(800);
    *(void **)(__ptr + 2) = pvVar3;
    __ptr_00 = (uint *)malloc(0x10);
    puVar4 = (undefined8 *)malloc(800);
    *(undefined8 **)(__ptr_00 + 2) = puVar4;
    __ptr_00[1] = 1;
    *puVar4 = pNode;
    uVar14 = 1;
    uVar17 = 0;
    local_48 = 100;
    uVar16 = 100;
    uVar13 = 100;
    lVar15 = 0;
    do {
      pvVar3 = *(void **)(__ptr_00 + 2);
      plVar1 = *(long **)((long)pvVar3 + lVar15 * 8);
      uVar12 = (ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
               *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
      if (((uVar12 & 1) == 0 && (*(uint *)(uVar12 + 0x14) & 0xf) == 7) &&
         (*(int *)(uVar12 + 0x2c) == 1)) {
        uVar8 = (uint)local_48;
        if (uVar14 == uVar8) {
          if (uVar8 < 0x10) {
            pvVar3 = realloc(pvVar3,0x80);
            local_48 = 0x10;
          }
          else {
            local_48 = (ulong)(uVar8 * 2);
            pvVar3 = realloc(pvVar3,local_48 * 8);
          }
          *(void **)(__ptr_00 + 2) = pvVar3;
          *__ptr_00 = (uint)local_48;
        }
        uVar11 = (ulong)uVar14;
        uVar14 = uVar14 + 1;
        puVar5 = (ulong *)((long)pvVar3 + uVar11 * 8);
      }
      else {
        uVar8 = (uint)uVar13;
        if (uVar17 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc(0x80);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar3;
            *__ptr = 0x10;
            uVar16 = 0x10;
            uVar13 = 0x10;
          }
          else {
            uVar8 = uVar8 * 2;
            uVar13 = (ulong)uVar8;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc(uVar13 * 8);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),uVar13 * 8);
            }
            *(void **)(__ptr + 2) = pvVar3;
            *__ptr = uVar8;
            uVar16 = (ulong)uVar8;
          }
        }
        else {
          pvVar3 = *(void **)(__ptr + 2);
        }
        lVar10 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        __ptr[1] = uVar17;
        puVar5 = (ulong *)((long)pvVar3 + lVar10 * 8);
      }
      *puVar5 = uVar12;
      uVar12 = (ulong)(*(uint *)((long)plVar1 + 0x14) >> 0xb & 1) ^
               *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                         (long)*(int *)(plVar1[4] + 4) * 8);
      if (((uVar12 & 1) == 0 && (*(uint *)(uVar12 + 0x14) & 0xf) == 7) &&
         (*(int *)(uVar12 + 0x2c) == 1)) {
        uVar8 = (uint)local_48;
        if (uVar14 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar3 = malloc(0x80);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar3;
            *__ptr_00 = 0x10;
            local_48 = 0x10;
          }
          else {
            local_48 = (ulong)(uVar8 * 2);
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar3 = malloc(local_48 * 8);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr_00 + 2),local_48 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar3;
            *__ptr_00 = uVar8 * 2;
          }
        }
        else {
          pvVar3 = *(void **)(__ptr_00 + 2);
        }
        uVar8 = uVar17;
        uVar9 = uVar14;
        uVar14 = uVar14 + 1;
      }
      else {
        uVar8 = (uint)uVar16;
        if (uVar17 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc(0x80);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar3;
            *__ptr = 0x10;
            uVar13 = 0x10;
          }
          else {
            uVar13 = (ulong)(uVar8 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc(uVar13 * 8);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),uVar13 * 8);
            }
            *(void **)(__ptr + 2) = pvVar3;
            *__ptr = uVar8 * 2;
          }
        }
        else {
          pvVar3 = *(void **)(__ptr + 2);
          uVar13 = uVar16;
        }
        __ptr[1] = uVar17 + 1;
        uVar16 = uVar13;
        uVar8 = uVar17 + 1;
        uVar9 = uVar17;
      }
      uVar17 = uVar8;
      *(ulong *)((long)pvVar3 + (long)(int)uVar9 * 8) = uVar12;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar14);
    if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_00 + 2));
    }
    free(__ptr_00);
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    uVar13 = 8;
    if (6 < uVar17 - 1) {
      uVar13 = (ulong)uVar17;
    }
    pVVar6->nSize = 0;
    iVar2 = (int)uVar13;
    pVVar6->nCap = iVar2;
    uVar16 = 0;
    if (iVar2 == 0) {
      ppvVar7 = (void **)0x0;
    }
    else {
      ppvVar7 = (void **)malloc((long)iVar2 << 3);
    }
    pVVar6->pArray = ppvVar7;
    if (0 < (int)uVar17) {
      uVar12 = (ulong)uVar17 + 1;
      uVar16 = 0;
      do {
        pvVar3 = *(void **)(*(long *)(__ptr + 2) + -0x10 + uVar12 * 8);
        iVar2 = (int)uVar13;
        if ((int)uVar16 == iVar2) {
          if (iVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar7;
            pVVar6->nCap = 0x10;
            uVar13 = 0x10;
          }
          else {
            uVar13 = (ulong)(uint)(iVar2 * 2);
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(uVar13 * 8);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,uVar13 * 8);
            }
            pVVar6->pArray = ppvVar7;
            pVVar6->nCap = iVar2 * 2;
          }
        }
        else {
          ppvVar7 = pVVar6->pArray;
        }
        ppvVar7[uVar16] = pvVar3;
        uVar16 = uVar16 + 1;
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
      pVVar6->nSize = (int)uVar16;
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
    }
    free(__ptr);
    if (1 < (int)uVar16) {
      ppvVar7 = pVVar6->pArray;
      qsort(ppvVar7,uVar16 & 0xffffffff,8,Vec_CompareNodeIds);
      iVar2 = 1;
      uVar13 = 1;
      do {
        if (ppvVar7[uVar13] != ppvVar7[uVar13 - 1]) {
          lVar15 = (long)iVar2;
          iVar2 = iVar2 + 1;
          ppvVar7[lVar15] = ppvVar7[uVar13];
        }
        uVar13 = uVar13 + 1;
      } while ((uVar16 & 0xffffffff) != uVar13);
      pVVar6->nSize = iVar2;
    }
    return pVVar6;
  }
  __assert_fail("Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                ,0x26a,"Vec_Ptr_t *Abc_NodeGetSuper(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NodeGetSuper( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vSuper, * vFront;
    Abc_Obj_t * pAnd, * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode) );
    vSuper = Vec_PtrAlloc( 100 ); 
    // explore the frontier
    vFront = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vFront, pNode );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pAnd, i )
    {
        pFanin = Abc_ObjChild0(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );

        pFanin = Abc_ObjChild1(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );
    }
    Vec_PtrFree( vFront );
    // reverse the array of pointers to start with lower IDs
    vFront = Vec_PtrAlloc( Vec_PtrSize(vSuper) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vSuper, pNode, i )
        Vec_PtrPush( vFront, pNode );
    Vec_PtrFree( vSuper );
    vSuper = vFront;
    // uniquify and return the frontier
    Vec_PtrUniqify( vSuper, (int (*)())Vec_CompareNodeIds );
    return vSuper;
}